

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O3

void mpc_sbox_prove_uint64_10(uint64_t *in,view_t *view,uint64_t *rvec)

{
  ulong uVar1;
  bool bVar2;
  ulong *puVar3;
  uint64_t *first;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  uint64_t *first_00;
  uint64_t *res;
  uint64_t *puVar7;
  uint64_t *puVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  uint64_t x1s [3];
  uint64_t x0s [3];
  uint64_t r2m [3];
  uint64_t x2m [3];
  uint64_t r1m [3];
  uint64_t r0s [3];
  uint64_t r0m [3];
  uint64_t r1s [3];
  undefined1 local_128 [32];
  undefined1 local_108 [32];
  undefined1 local_e8 [32];
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  uint64_t local_48 [3];
  undefined1 auVar13 [32];
  
  auVar19._8_8_ = 0x9249249000000000;
  auVar19._0_8_ = 0x9249249000000000;
  auVar19._16_8_ = 0x9249249000000000;
  auVar19._24_8_ = 0x9249249000000000;
  first = (uint64_t *)local_108;
  first_00 = (uint64_t *)local_128;
  res = (uint64_t *)local_e8;
  auVar9 = vmovdqu64_avx512vl(*(undefined1 (*) [32])in);
  auVar12._0_24_ = auVar9._0_24_;
  auVar12._24_8_ = 0;
  auVar9 = vmovdqu64_avx512vl(*(undefined1 (*) [32])rvec);
  auVar10._0_24_ = auVar9._0_24_;
  auVar10._24_8_ = 0;
  auVar9 = vpsllq_avx2(auVar12,2);
  auVar9 = vpand_avx2(auVar9,auVar19);
  local_108 = vmovdqu64_avx512vl(auVar9);
  auVar9 = vpaddq_avx2(auVar12,auVar12);
  auVar11 = vpand_avx2(auVar12,auVar19);
  auVar9 = vpand_avx2(auVar9,auVar19);
  local_c8 = vmovdqu64_avx512vl(auVar11);
  auVar11._8_8_ = 0x2492492400000000;
  auVar11._0_8_ = 0x2492492400000000;
  auVar11._16_8_ = 0x2492492400000000;
  auVar11._24_8_ = 0x2492492400000000;
  auVar11 = vpandq_avx512vl(auVar10,auVar11);
  auVar12 = vmovdqu64_avx512vl(local_108);
  auVar13._0_24_ = auVar12._0_24_;
  auVar13._24_8_ = 0;
  local_128 = vmovdqu64_avx512vl(auVar9);
  auVar9._8_8_ = 0x4924924800000000;
  auVar9._0_8_ = 0x4924924800000000;
  auVar9._16_8_ = 0x4924924800000000;
  auVar9._24_8_ = 0x4924924800000000;
  auVar12 = vpandq_avx512vl(auVar10,auVar9);
  auVar9 = vpand_avx2(auVar10,auVar19);
  local_e8 = vmovdqu64_avx512vl(auVar9);
  vpmovsxbq_avx(ZEXT216(0x201));
  auVar9 = vmovdqu64_avx512vl(local_128);
  auVar14._0_24_ = auVar9._0_24_;
  auVar14._24_8_ = 0;
  auVar9 = vmovdqu64_avx512vl(local_e8);
  auVar15._0_24_ = auVar9._0_24_;
  auVar15._24_8_ = 0;
  local_68 = vmovdqu64_avx512vl(auVar11);
  auVar9 = vpsllq_avx2(auVar11,2);
  local_88 = vmovdqu64_avx512vl(auVar9);
  auVar9 = vpaddq_avx2(auVar12,auVar12);
  local_a8 = vmovdqu64_avx512vl(auVar12);
  _local_48 = vmovdqu64_avx512vl(auVar9);
  auVar9 = vpgatherqq_avx512vl(first_00[(long)local_48]);
  auVar16._0_24_ = auVar9._0_24_;
  auVar16._24_8_ = 0;
  auVar9 = vpgatherqq_avx512vl(first[(long)local_48]);
  auVar17._0_24_ = auVar9._0_24_;
  auVar17._24_8_ = 0;
  auVar9 = vpgatherqq_avx512vl(res[(long)local_48]);
  auVar18._0_24_ = auVar9._0_24_;
  auVar18._24_8_ = 0;
  auVar9 = vpternlogq_avx512vl(auVar13,auVar16,auVar14,0x60);
  auVar9 = vpternlogq_avx512vl(auVar9,auVar17,auVar14,0x78);
  auVar9 = vpternlogq_avx512vl(auVar9,auVar18,auVar15,0x96);
  local_68 = vmovdqu64_avx512vl(auVar9);
  auVar9 = vmovdqu64_avx512vl(auVar9);
  *(undefined1 (*) [32])view->s[0].w64 = auVar9;
  mpc_and_uint64(res,first_00,(uint64_t *)local_c8,local_48,view,1);
  mpc_and_uint64((uint64_t *)local_a8,first,(uint64_t *)local_c8,(uint64_t *)local_88,view,2);
  lVar5 = 0;
  puVar3 = (ulong *)local_68;
  puVar7 = (uint64_t *)local_c8;
  puVar8 = (uint64_t *)local_a8;
  bVar2 = true;
  do {
    bVar4 = bVar2;
    uVar1 = *first;
    first = (uint64_t *)(local_108 + 8);
    uVar6 = uVar1 ^ *first_00;
    first_00 = (uint64_t *)(local_128 + 8);
    in[lVar5] = (*puVar8 ^ uVar6) >> 1 ^ in[lVar5] & 0x3ffffffff ^ uVar6 ^
                (*res ^ uVar1) >> 2 ^ *puVar3 ^ *puVar7;
    lVar5 = 1;
    res = (uint64_t *)(local_e8 + 8);
    puVar3 = (ulong *)(local_68 + 8);
    puVar7 = (uint64_t *)(local_c8 + 8);
    puVar8 = (uint64_t *)(local_a8 + 8);
    bVar2 = false;
  } while (bVar4);
  return;
}

Assistant:

static void mpc_sbox_prove_uint64_10(uint64_t* in, view_t* view, uint64_t const* rvec) {
  bitsliced_step_1_uint64_10(SC_PROOF);

  mpc_and_uint64(r0m, x0s, x1s, r2m, view, 0);
  mpc_and_uint64(r2m, x1s, x2m, r1s, view, 1);
  mpc_and_uint64(r1m, x0s, x2m, r0s, view, 2);

  bitsliced_step_2_uint64_10(SC_PROOF - 1);
}